

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::GetLevelParameterTest::iterate(GetLevelParameterTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  float fVar7;
  Enum<int,_2UL> EVar8;
  Enum<int,_2UL> local_6e0;
  MessageBuilder local_6d0;
  GetNameFunc local_550;
  int local_548;
  Enum<int,_2UL> local_540;
  MessageBuilder local_530;
  int local_3ac;
  float local_3a8;
  GLenum error_1;
  GLfloat result_dsa_1;
  GLfloat result_legacy_1;
  GLuint j_1;
  GLuint i_1;
  int local_390;
  Enum<int,_2UL> local_388;
  MessageBuilder local_378;
  GetNameFunc local_1f8;
  int local_1f0;
  Enum<int,_2UL> local_1e8;
  MessageBuilder local_1d8;
  int local_58;
  GLenum local_54;
  GLenum error;
  GLint result_dsa;
  GLint result_legacy;
  GLuint j;
  GLuint i;
  int local_34;
  byte local_2f;
  byte local_2e;
  undefined1 local_2d;
  GLuint texture;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  GetLevelParameterTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  texture = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)texture);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    local_2e = 1;
    local_2f = 0;
    local_34 = 0;
    (**(code **)(lStack_20 + 0x6f8))(1,&local_34);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e11);
    (**(code **)(lStack_20 + 0xb8))(0x806f,local_34);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e14);
    (**(code **)(lStack_20 + 0x1320))(0x806f,0,0x8058,4,4,4,0,0x1908,0x1401,s_texture_data);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e18);
    (**(code **)(lStack_20 + 0x1320))(0x806f,1,0x8058,2,2,2,0,0x1908,0x1401,s_texture_data);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e1c);
    for (result_legacy = 0; (uint)result_legacy < 2; result_legacy = result_legacy + 1) {
      for (result_dsa = 0; (uint)result_dsa < 0xf; result_dsa = result_dsa + 1) {
        error = 0;
        local_54 = 0;
        (**(code **)(lStack_20 + 0xab0))
                  (0x806f,result_legacy,iterate::pnames[(uint)result_dsa],&error);
        dVar2 = (**(code **)(lStack_20 + 0x800))();
        glu::checkError(dVar2,"glGetTexLevelParameteriv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0x1e30);
        (**(code **)(lStack_20 + 0xae8))
                  (local_34,result_legacy,iterate::pnames[(uint)result_dsa],&local_54);
        local_58 = 0;
        local_58 = (**(code **)(lStack_20 + 0x800))();
        if (local_58 == 0) {
          if (error != local_54) {
            pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar5 = tcu::TestContext::getLog(pTVar4);
            tcu::TestLog::operator<<(&local_378,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_378,(char (*) [20])"For parameter name ");
            EVar8 = glu::getTextureLevelParameterStr(iterate::pnames[(uint)result_dsa]);
            _j_1 = EVar8.m_getName;
            local_390 = EVar8.m_value;
            local_388.m_getName = _j_1;
            local_388.m_value = local_390;
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_388);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(char (*) [38])" GetTextureLevelParameteriv returned ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_54);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(char (*) [66])
                                       ", but reference value (queried using GetTexLevelParameteriv) was "
                               );
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&error);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])0x2a850ac);
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_378);
            local_2e = 0;
          }
        }
        else {
          pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar5 = tcu::TestContext::getLog(pTVar4);
          tcu::TestLog::operator<<(&local_1d8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_1d8,
                              (char (*) [57])
                              "GetTextureLevelParameteriv unexpectedly generated error ");
          EVar8 = glu::getErrorStr(local_58);
          local_1f8 = EVar8.m_getName;
          local_1f0 = EVar8.m_value;
          local_1e8.m_getName = local_1f8;
          local_1e8.m_value = local_1f0;
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1e8);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])0x2a850ac);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1d8);
          local_2e = 0;
        }
      }
    }
    for (result_legacy_1 = 0.0; (uint)result_legacy_1 < 2;
        result_legacy_1 = (GLfloat)((int)result_legacy_1 + 1)) {
      for (result_dsa_1 = 0.0; (uint)result_dsa_1 < 0xf;
          result_dsa_1 = (GLfloat)((int)result_dsa_1 + 1)) {
        error_1 = 0;
        local_3a8 = 0.0;
        (**(code **)(lStack_20 + 0xaa8))
                  (0x806f,result_legacy_1,iterate::pnames[(uint)result_dsa_1],&error_1);
        dVar2 = (**(code **)(lStack_20 + 0x800))();
        glu::checkError(dVar2,"glGetTexLevelParameterfv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0x1e5b);
        (**(code **)(lStack_20 + 0xae0))
                  (local_34,result_legacy_1,iterate::pnames[(uint)result_dsa_1],&local_3a8);
        local_3ac = 0;
        local_3ac = (**(code **)(lStack_20 + 0x800))();
        if (local_3ac == 0) {
          fVar7 = de::abs<float>((float)error_1 - local_3a8);
          if (0.125 < fVar7) {
            pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar5 = tcu::TestContext::getLog(pTVar4);
            tcu::TestLog::operator<<(&local_6d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_6d0,(char (*) [20])"For parameter name ");
            EVar8 = glu::getTextureLevelParameterStr(iterate::pnames[(uint)result_dsa_1]);
            local_6e0.m_getName = EVar8.m_getName;
            local_6e0.m_value = EVar8.m_value;
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_6e0);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(char (*) [38])" GetTextureLevelParameterfv returned ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3a8);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(char (*) [66])
                                       ", but reference value (queried using GetTexLevelParameterfv) was "
                               );
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)&error_1);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])0x2a850ac);
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_6d0);
            local_2e = 0;
          }
        }
        else {
          pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar5 = tcu::TestContext::getLog(pTVar4);
          tcu::TestLog::operator<<(&local_530,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_530,
                              (char (*) [57])
                              "GetTextureLevelParameterfv unexpectedly generated error ");
          EVar8 = glu::getErrorStr(local_3ac);
          local_550 = EVar8.m_getName;
          local_548 = EVar8.m_value;
          local_540.m_getName = local_550;
          local_540.m_value = local_548;
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_540);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])0x2a850ac);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_530);
          local_2e = 0;
        }
      }
    }
    if (local_34 != 0) {
      (**(code **)(lStack_20 + 0x480))(1);
    }
    do {
      iVar1 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar1 != 0);
    if ((local_2e & 1) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetLevelParameterTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint texture = 0;

	try
	{
		/* Texture initiation. */
		gl.genTextures(1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_3D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, s_texture_width, s_texture_height, s_texture_depth, 0, GL_RGBA,
					  GL_UNSIGNED_BYTE, s_texture_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		gl.texImage3D(GL_TEXTURE_3D, 1, GL_RGBA8, s_texture_width / 2, s_texture_height / 2, s_texture_depth / 2, 0,
					  GL_RGBA, GL_UNSIGNED_BYTE, s_texture_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		static const glw::GLenum pnames[] = {
			GL_TEXTURE_WIDTH,	  GL_TEXTURE_HEIGHT,	 GL_TEXTURE_DEPTH,		 GL_TEXTURE_INTERNAL_FORMAT,
			GL_TEXTURE_RED_TYPE,   GL_TEXTURE_GREEN_TYPE, GL_TEXTURE_BLUE_TYPE,  GL_TEXTURE_ALPHA_TYPE,
			GL_TEXTURE_DEPTH_TYPE, GL_TEXTURE_RED_SIZE,   GL_TEXTURE_GREEN_SIZE, GL_TEXTURE_BLUE_SIZE,
			GL_TEXTURE_ALPHA_SIZE, GL_TEXTURE_DEPTH_SIZE, GL_TEXTURE_COMPRESSED
		};
		static const glw::GLuint pnames_count = sizeof(pnames) / sizeof(pnames[0]);

		/* Test GetTextureLevelParameteriv. */
		for (glw::GLuint i = 0; i < 2 /* levels */; ++i)
		{
			for (glw::GLuint j = 0; j < pnames_count; ++j)
			{
				glw::GLint result_legacy = 0;
				glw::GLint result_dsa	= 0;

				/* Quering reference value. */
				gl.getTexLevelParameteriv(GL_TEXTURE_3D, i, pnames[j], &result_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

				/* Quering using DSA function. */
				gl.getTextureLevelParameteriv(texture, i, pnames[j], &result_dsa);

				/* Check for errors. */
				glw::GLenum error = GL_NO_ERROR;

				if (GL_NO_ERROR != (error = gl.getError()))
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetTextureLevelParameteriv unexpectedly generated error "
						<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

					is_ok = false;
				}
				else
				{
					/* Compare values. */
					if (result_legacy != result_dsa)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "For parameter name "
							<< glu::getTextureLevelParameterStr(pnames[j]) << " GetTextureLevelParameteriv returned "
							<< result_dsa << ", but reference value (queried using GetTexLevelParameteriv) was "
							<< result_legacy << ". Test fails." << tcu::TestLog::EndMessage;

						is_ok = false;
					}
				}
			}
		}

		/* Test GetTextureLevelParameterfv. */
		for (glw::GLuint i = 0; i < 2 /* levels */; ++i)
		{
			for (glw::GLuint j = 0; j < pnames_count; ++j)
			{
				glw::GLfloat result_legacy = 0.f;
				glw::GLfloat result_dsa	= 0.f;

				/* Quering reference value. */
				gl.getTexLevelParameterfv(GL_TEXTURE_3D, i, pnames[j], &result_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameterfv has failed");

				/* Quering using DSA function. */
				gl.getTextureLevelParameterfv(texture, i, pnames[j], &result_dsa);

				/* Check for errors. */
				glw::GLenum error = GL_NO_ERROR;

				if (GL_NO_ERROR != (error = gl.getError()))
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetTextureLevelParameterfv unexpectedly generated error "
						<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

					is_ok = false;
				}
				else
				{
					/* Compare values. */
					if (de::abs(result_legacy - result_dsa) > 0.125 /* Precision. */)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "For parameter name "
							<< glu::getTextureLevelParameterStr(pnames[j]) << " GetTextureLevelParameterfv returned "
							<< result_dsa << ", but reference value (queried using GetTexLevelParameterfv) was "
							<< result_legacy << ". Test fails." << tcu::TestLog::EndMessage;

						is_ok = false;
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}